

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

bool __thiscall sf::priv::GlContext::setActive(GlContext *this,bool active)

{
  uint uVar1;
  GlContext *pGVar2;
  Lock local_40;
  Lock lock_1;
  Lock local_28;
  Lock lock;
  bool active_local;
  GlContext *this_local;
  
  lock.m_mutex._7_1_ = active;
  if (active) {
    pGVar2 = ThreadLocalPtr::operator_cast_to_GlContext_
                       ((ThreadLocalPtr *)&(anonymous_namespace)::currentContext);
    if (this == pGVar2) {
      this_local._7_1_ = true;
    }
    else {
      Lock::Lock(&local_28,(Mutex *)&(anonymous_namespace)::mutex);
      uVar1 = (*this->_vptr_GlContext[4])(this,1);
      this_local._7_1_ = (uVar1 & 1) != 0;
      if (this_local._7_1_) {
        ThreadLocalPtr<sf::priv::GlContext>::operator=
                  ((ThreadLocalPtr<sf::priv::GlContext> *)&(anonymous_namespace)::currentContext,
                   this);
      }
      lock_1.m_mutex._0_4_ = 1;
      Lock::~Lock(&local_28);
    }
  }
  else {
    pGVar2 = ThreadLocalPtr::operator_cast_to_GlContext_
                       ((ThreadLocalPtr *)&(anonymous_namespace)::currentContext);
    if (this == pGVar2) {
      Lock::Lock(&local_40,(Mutex *)&(anonymous_namespace)::mutex);
      uVar1 = (*this->_vptr_GlContext[4])(this,0);
      this_local._7_1_ = (uVar1 & 1) != 0;
      if (this_local._7_1_) {
        ThreadLocalPtr<sf::priv::GlContext>::operator=
                  ((ThreadLocalPtr<sf::priv::GlContext> *)&(anonymous_namespace)::currentContext,
                   (GlContext *)0x0);
      }
      lock_1.m_mutex._0_4_ = 1;
      Lock::~Lock(&local_40);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GlContext::setActive(bool active)
{
    if (active)
    {
        if (this != currentContext)
        {
            Lock lock(mutex);

            // Activate the context
            if (makeCurrent(true))
            {
                // Set it as the new current context for this thread
                currentContext = this;
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            // This context is already the active one on this thread, don't do anything
            return true;
        }
    }
    else
    {
        if (this == currentContext)
        {
            Lock lock(mutex);

            // Deactivate the context
            if (makeCurrent(false))
            {
                currentContext = NULL;
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            // This context is not the active one on this thread, don't do anything
            return true;
        }
    }
}